

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O0

void google::protobuf::internal::LogIndexOutOfBounds(int index,int size)

{
  LogMessage *pLVar1;
  LogMessage local_28;
  Voidify local_11;
  int local_10;
  int local_c;
  int size_local;
  int index_local;
  
  local_10 = size;
  local_c = index;
  absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
            ((LogMessageDebugFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.cc"
             ,0x21);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [7])"Index ");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,local_c);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [16])" out of bounds ");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,local_10);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar1);
  absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
            ((LogMessageDebugFatal *)&local_28);
  return;
}

Assistant:

void LogIndexOutOfBounds(int index, int size) {
  ABSL_DLOG(FATAL) << "Index " << index << " out of bounds " << size;
}